

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::
       format_decimal<unsigned_long,char,fmt::v5::internal::add_thousands_sep<char>>
                 (char *buffer,unsigned_long value,uint num_digits,
                 add_thousands_sep<char> thousands_sep)

{
  long lVar1;
  uint index;
  uint index_1;
  char *end;
  unsigned_long uStack_20;
  uint num_digits_local;
  unsigned_long value_local;
  char *buffer_local;
  
  uStack_20 = value;
  value_local = (unsigned_long)(buffer + num_digits);
  while (99 < uStack_20) {
    lVar1 = (uStack_20 % 100) * 2;
    uStack_20 = uStack_20 / 100;
    *(undefined1 *)(value_local - 1) = basic_data<void>::DIGITS[(int)lVar1 + 1];
    value_local = value_local - 1;
    add_thousands_sep<char>::operator()(&thousands_sep,(char **)&value_local);
    *(undefined1 *)(value_local - 1) = basic_data<void>::DIGITS[lVar1];
    value_local = value_local - 1;
    add_thousands_sep<char>::operator()(&thousands_sep,(char **)&value_local);
  }
  if (uStack_20 < 10) {
    *(char *)(value_local - 1) = (char)uStack_20 + '0';
  }
  else {
    *(undefined1 *)(value_local - 1) = basic_data<void>::DIGITS[(int)(uStack_20 << 1) + 1];
    value_local = value_local - 1;
    add_thousands_sep<char>::operator()(&thousands_sep,(char **)&value_local);
    *(undefined1 *)(value_local - 1) = basic_data<void>::DIGITS[uStack_20 << 1 & 0xffffffff];
  }
  return buffer + num_digits;
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, unsigned num_digits,
                            ThousandsSep thousands_sep) {
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = data::DIGITS[index];
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = data::DIGITS[index + 1];
  thousands_sep(buffer);
  *--buffer = data::DIGITS[index];
  return end;
}